

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip.c
# Opt level: O0

void write_contents(archive *a)

{
  archive_entry *paVar1;
  archive_entry *in_RDI;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  void *in_stack_00000010;
  archive_entry *ae;
  wchar_t in_stack_00000028;
  archive_entry *in_stack_ffffffffffffffd8;
  void *pvVar2;
  archive_entry *paVar3;
  archive_entry *paVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  uint in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  wchar_t wVar6;
  
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_entry_set_mtime(paVar1,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)in_stack_ffffffffffffffd8);
  archive_entry_set_mode(paVar1,0x81ed);
  archive_entry_set_size(paVar1,8);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x2212fc,in_stack_00000010);
  archive_entry_free((archive_entry *)0x221306);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pvVar2
                     ,0x22131c);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x22134d,in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pvVar2
                     ,0x221363);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221391,in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_set_mtime(paVar1,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar1,0x81ed);
  archive_entry_set_size(paVar1,4);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221444,in_stack_00000010);
  archive_entry_free((archive_entry *)0x22144e);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pvVar2
                     ,0x221464);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221495,in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_set_mtime(paVar1,2,0xf);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar1,0x8191);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_entry_unset_size((archive_entry *)0x221506);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221543,in_stack_00000010);
  archive_entry_free((archive_entry *)0x22154d);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pvVar2
                     ,0x221563);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221594,in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),pvVar2);
  archive_entry_set_mtime(paVar1,1,10);
  archive_entry_mtime(paVar1);
  assertion_equal_int((char *)in_RDI,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221616,in_stack_00000010);
  archive_entry_mtime_nsec(paVar1);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_RDI,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x221651,in_stack_00000010);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_pathname(paVar3);
  paVar3 = (archive_entry *)0x0;
  uVar5 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_RDI,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_copy_symlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_symlink(paVar3);
  uVar5 = 0;
  assertion_equal_string
            (in_stack_00000008,unaff_retaddr,(char *)in_RDI,(char *)paVar1,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)((ulong)in_stack_ffffffffffffffe4 << 0x20),a,in_stack_00000028);
  archive_entry_set_mode(paVar1,0xa1ed);
  archive_entry_mode(paVar1);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_RDI,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x22174d,
                      in_stack_00000010);
  archive_entry_set_size(paVar1,4);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221799,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x2217a3);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  archive_entry_set_mtime(paVar1,0xb,0x6e);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_set_mode(paVar1,0x41ed);
  archive_entry_set_size(paVar1,0x200);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  assertion_equal_int((char *)in_RDI,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)in_RDI,
                      (char *)0x221857,in_stack_00000010);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar1);
  pvVar2 = (void *)0x0;
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x22189d,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x2218a7);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x2218bd);
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)in_RDI,
                      (char *)0x2218ec,in_stack_00000010);
  archive_write_zip_set_compression_deflate
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = in_RDI;
  assertion_equal_int((char *)in_RDI,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)in_RDI,
                      (char *)0x221925,in_stack_00000010);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),in_RDI);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)in_RDI);
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,8);
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),in_RDI);
  paVar3 = paVar1;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar1,
                      (char *)0x2219d9,in_stack_00000010);
  archive_entry_free((archive_entry *)0x2219e3);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar1,0x2219f9);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar3,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221a2a,
                      in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x221a40);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar3,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221a6e,
                      in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar1,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar1,0x81ed);
  archive_entry_set_size(paVar1,4);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar3,
                      (char *)0x221b22,in_stack_00000010);
  archive_entry_free((archive_entry *)0x221b2c);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3,0x221b42);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221b73,
                      in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  archive_entry_set_mtime(paVar1,2,0xf);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_set_mode(paVar1,0x8191);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_entry_unset_size((archive_entry *)0x221be4);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221c21,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x221c2b);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x221c41);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221c72,
                      in_stack_00000010);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  archive_entry_set_mtime(paVar1,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_copy_symlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_set_mode(paVar1,0xa1ed);
  archive_entry_set_size(paVar1,4);
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221d36,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x221d40);
  paVar1 = archive_entry_new();
  assertion_assert((char *)paVar1,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  archive_entry_set_mtime(paVar1,0xb,0x6e);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar3);
  archive_entry_set_mode(paVar1,0x41ed);
  archive_entry_set_size(paVar1,0x200);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar3);
  assertion_equal_int((char *)paVar4,(wchar_t)((ulong)paVar1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar4,
                      (char *)0x221df4,in_stack_00000010);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar1);
  pvVar2 = (void *)0x0;
  wVar6 = (wchar_t)((ulong)paVar1 >> 0x20);
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221e3a,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x221e44);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x221e5a);
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar4,
                      (char *)0x221e89,in_stack_00000010);
  archive_write_finish_entry((archive *)0x221e93);
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar4,
                      (char *)0x221ec2,in_stack_00000010);
  archive_write_zip_set_compression_store
            ((archive *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  paVar1 = paVar4;
  assertion_equal_int((char *)paVar4,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar4,
                      (char *)0x221efb,in_stack_00000010);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,8);
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221fae,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x221fb8);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x221fce);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x221fff,
                      in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x222015);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x222043,
                      in_stack_00000010);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,4);
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x2220f6,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x222100);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x222116);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x222147,
                      in_stack_00000010);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar3,2,0xf);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar3,0x8191);
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  archive_entry_unset_size((archive_entry *)0x2221b8);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x2221f5,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x2221ff);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x222215);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x222246,
                      in_stack_00000010);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_copy_symlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar3,0xa1ed);
  archive_entry_set_size(paVar3,4);
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  paVar4 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x22230a,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x222314);
  paVar3 = archive_entry_new();
  assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  archive_entry_set_mtime(paVar3,0xb,0x6e);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(char *)paVar4);
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),paVar4);
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)paVar3 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar1,
                      (char *)0x2223c8,in_stack_00000010);
  failure("size should be zero so that applications know not to write");
  archive_entry_size(paVar3);
  pvVar2 = (void *)0x0;
  wVar6 = (wchar_t)((ulong)paVar3 >> 0x20);
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x22240e,
                      in_stack_00000010);
  archive_entry_free((archive_entry *)0x222418);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),pvVar2,0x22242e);
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),(longlong)paVar1,
                      (char *)0x22245d,in_stack_00000010);
  archive_write_close((archive *)0x222467);
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x222495,
                      in_stack_00000010);
  archive_write_free((archive *)0x22249f);
  assertion_equal_int((char *)paVar1,wVar6,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar5),0,(char *)0x2224cd,
                      in_stack_00000010);
  return;
}

Assistant:

static void
write_contents(struct archive *a)
{
	struct archive_entry *ae;

	/*
	 * First write things with the "default" compression.
	 * The library will choose "deflate" for most things if it's
	 * available, else "store".
	 */

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "1234", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "mnopq", 5));

	/*
	 * Write symbolic link.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "symlink");
	assertEqualString("symlink", archive_entry_pathname(ae));
	archive_entry_copy_symlink(ae, "file1");
	assertEqualString("file1", archive_entry_symlink(ae));
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 4);

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/*
	 * Force "deflate" compression if the platform supports it.
	 */
#ifdef HAVE_ZLIB_H
	assertEqualIntA(a, ARCHIVE_OK, archive_write_zip_set_compression_deflate(a));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "1234", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "ghijk", 5));

	/*
	 * Write symbolic like file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "symlink_deflate");
	archive_entry_copy_symlink(ae, "file1");
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir_deflate");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
#endif

	/*
	 * Now write a bunch of entries with "store" compression.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_zip_set_compression_store(a));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "ACEG", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "ijklm", 5));

	/*
	 * Write symbolic like file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "symlink_stored");
	archive_entry_copy_symlink(ae, "file1");
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir_stored");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));


	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}